

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-1.c
# Opt level: O3

int CheckFromArray(void)

{
  int iVar1;
  undefined8 in_RAX;
  FILE *__stream;
  char *pcVar2;
  int n;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  __stream = fopen("out.txt","r");
  if (__stream == (FILE *)0x0) {
    puts("can\'t open out.txt");
    iVar1 = -1;
    goto LAB_00102451;
  }
  pcVar2 = ScanInt((FILE *)__stream,&local_14);
  if (pcVar2 == "PASSED") {
    if (testInOut[testN].n != local_14) {
      printf("wrong output -- ");
      goto LAB_00102438;
    }
    iVar1 = HaveGarbageAtTheEnd((FILE *)__stream);
    fclose(__stream);
    if (iVar1 == 0) {
      puts("PASSED");
      iVar1 = 0;
      goto LAB_00102451;
    }
  }
  else {
LAB_00102438:
    fclose(__stream);
  }
  puts("FAILED");
  iVar1 = 1;
LAB_00102451:
  testN = testN + 1;
  return iVar1;
}

Assistant:

static int CheckFromArray(void)
{
    FILE *const out = fopen("out.txt", "r");
    int passed = 1;
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    {
        int n;
        if (ScanInt(out, &n) != Pass) {
            passed = 0;
        } else if (testInOut[testN].n != n) {
            passed = 0;
            printf("wrong output -- ");
        }
    }
    if (passed) {
        passed = !HaveGarbageAtTheEnd(out);
    }
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        testN++;
        return 0;
    } else {
        printf("FAILED\n");
        testN++;
        return 1;
    }
}